

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,uint64_t u64)

{
  ulong in_RSI;
  ulong *in_RDI;
  
  memset(in_RDI,0,0x10);
  *in_RDI = in_RSI;
  *(undefined2 *)((long)in_RDI + 0xe) = 0x116;
  if ((in_RSI & 0x8000000000000000) == 0) {
    *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x80;
  }
  if ((in_RSI & 0xffffffff00000000) == 0) {
    *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x40;
  }
  if ((in_RSI & 0xffffffff80000000) == 0) {
    *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x20;
  }
  return;
}

Assistant:

explicit GenericValue(uint64_t u64) RAPIDJSON_NOEXCEPT : data_() {
        data_.n.u64 = u64;
        data_.f.flags = kNumberUint64Flag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0x80000000, 0x00000000)))
            data_.f.flags |= kInt64Flag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x00000000)))
            data_.f.flags |= kUintFlag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
            data_.f.flags |= kIntFlag;
    }